

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O3

void FileUtil::output_latent_factors
               (string *output_file,value_type_conflict1 *data,int obj_num,int dim)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  value_type_conflict1 *pvVar4;
  double *pdVar5;
  ofstream fout;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)output_file);
  if (0 < obj_num) {
    uVar2 = 0;
    pvVar4 = data;
    do {
      uVar3 = (ulong)(dim - 1);
      pdVar5 = pvVar4;
      if (1 < dim) {
        do {
          poVar1 = std::ostream::_M_insert<double>(*pdVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
          pdVar5 = pdVar5 + (uint)obj_num;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      poVar1 = std::ostream::_M_insert<double>(data[(long)(dim * obj_num) + uVar2]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
      pvVar4 = pvVar4 + 1;
    } while (uVar2 != (uint)obj_num);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _MPI_Finalize;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void output_latent_factors(const string output_file, const value_type *data, const int obj_num, const int dim){
        // input is column-wise but output will be row-wise
        ofstream fout;
        fout.open(output_file);

        for (int obj_id = 0; obj_id < obj_num; obj_id++) {
            for (int d = 0; d < dim - 1; d++) {
                fout << data[d * obj_num + obj_id] << ",";
            }
            fout << data[dim * obj_num + obj_id] << endl;
        }

        fout.close();
    }